

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption
          (OptionInterpreter *this,Message *options,vector<int,_std::allocator<int>_> *src_path,
          vector<int,_std::allocator<int>_> *options_path,bool skip_extensions)

{
  uint8_t uVar1;
  string *psVar2;
  void *pvVar3;
  DescriptorBuilder *pDVar4;
  FieldDescriptor *innermost_field;
  Message *pMVar5;
  unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
  __p;
  pointer intermediate_fields_end;
  bool bVar6;
  bool bVar7;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>_>
  *pVVar8;
  Symbol this_00;
  UnknownFieldSet *pUVar9;
  MappedReference<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::vector<int>,_int>_>
  piVar10;
  MappedReference<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::vector<int>,_std::vector<int>_>_>
  this_01;
  LogMessage *pLVar11;
  code *pcVar12;
  int iVar13;
  DescriptorBuilder *pDVar14;
  size_type *psVar15;
  pointer ppFVar16;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  string_view name;
  string_view name_00;
  string_view name_01;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_02;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_03;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_04;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_05;
  Metadata MVar17;
  string_view relative_to;
  FieldDescriptor *field;
  Message *local_130;
  unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
  parent_unknown_fields;
  string outstr;
  Descriptor *descriptor;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  intermediate_fields;
  vector<int,_std::allocator<int>_> dest_path;
  string debug_msg_name;
  unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
  unknown_fields;
  char *local_88;
  AlphaNum local_60;
  
  if (*(int *)((long)&this->uninterpreted_option_->field_0 + 0x10) == 0) {
    if (skip_extensions) {
      return true;
    }
    pcVar12 = absl::lts_20240722::functional_internal::
              InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption(google::protobuf::Message*,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,bool)::__0,std::__cxx11::string>
    ;
LAB_001d0e79:
    make_error.invoker_ = pcVar12;
    make_error.ptr_.obj = &outstr;
    bVar6 = AddNameError(this,make_error);
    return bVar6;
  }
  pVVar8 = internal::RepeatedPtrFieldBase::
           Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                     (&(this->uninterpreted_option_->field_0)._impl_.name_.
                       super_RepeatedPtrFieldBase,0);
  bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((ulong)(pVVar8->field_0)._impl_.name_part_.tagged_ptr_.ptr_ &
                          0xfffffffffffffffc),"uninterpreted_option");
  if (bVar6) {
    if (skip_extensions) {
      return true;
    }
    pcVar12 = absl::lts_20240722::functional_internal::
              InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption(google::protobuf::Message*,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,bool)::__1,std::__cxx11::string>
    ;
    goto LAB_001d0e79;
  }
  local_130 = options;
  pVVar8 = internal::RepeatedPtrFieldBase::
           Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                     (&(this->uninterpreted_option_->field_0)._impl_.name_.
                       super_RepeatedPtrFieldBase,0);
  pMVar5 = local_130;
  if ((pVVar8->field_0)._impl_.is_extension_ == skip_extensions) {
    return true;
  }
  pDVar14 = this->builder_;
  MVar17 = Message::GetMetadata(local_130);
  psVar2 = (MVar17.descriptor)->all_names_;
  name._M_str = psVar2[1]._M_dataplus._M_p;
  name._M_len = psVar2[1]._M_string_length;
  this_00 = FindSymbolNotEnforcingDeps(pDVar14,name,true);
  if ((this_00.ptr_)->symbol_type_ != '\x01') {
    MVar17 = Message::GetMetadata(pMVar5);
    this_00.ptr_ = &(MVar17.descriptor)->super_SymbolBase;
    if ((DescriptorBuilder *)this_00.ptr_ == (DescriptorBuilder *)0x0) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&outstr,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/descriptor.cc"
                 ,0x223c,0x12,"options_descriptor");
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&outstr);
    }
  }
  field = (FieldDescriptor *)0x0;
  intermediate_fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  intermediate_fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  intermediate_fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  descriptor = (Descriptor *)this_00.ptr_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&debug_msg_name,"",(allocator<char> *)&outstr);
  std::vector<int,_std::allocator<int>_>::vector(&dest_path,options_path);
  for (iVar13 = 0; iVar13 < *(int *)((long)&this->uninterpreted_option_->field_0 + 0x10);
      iVar13 = iVar13 + 1) {
    pDVar14 = this->builder_;
    (pDVar14->undefine_resolved_name_)._M_string_length = 0;
    *(pDVar14->undefine_resolved_name_)._M_dataplus._M_p = '\0';
    pVVar8 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                       (&(this->uninterpreted_option_->field_0)._impl_.name_.
                         super_RepeatedPtrFieldBase,iVar13);
    pvVar3 = (pVVar8->field_0)._impl_.name_part_.tagged_ptr_.ptr_;
    if (debug_msg_name._M_string_length != 0) {
      outstr._0_16_ = absl::lts_20240722::NullSafeStringView(".");
      absl::lts_20240722::StrAppend((string *)&debug_msg_name,(AlphaNum *)&outstr);
    }
    pVVar8 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                       (&(this->uninterpreted_option_->field_0)._impl_.name_.
                         super_RepeatedPtrFieldBase,iVar13);
    psVar15 = (size_type *)((ulong)pvVar3 & 0xfffffffffffffffc);
    if ((pVVar8->field_0)._impl_.is_extension_ == true) {
      outstr._0_16_ = absl::lts_20240722::NullSafeStringView("(");
      local_60.piece_._M_str = (char *)*psVar15;
      local_60.piece_._M_len = psVar15[1];
      _unknown_fields = absl::lts_20240722::NullSafeStringView(")");
      absl::lts_20240722::StrAppend
                ((string *)&debug_msg_name,(AlphaNum *)&outstr,&local_60,(AlphaNum *)&unknown_fields
                );
      pDVar14 = this->builder_;
      name_00._M_str = (char *)*psVar15;
      name_00._M_len = psVar15[1];
      relative_to._M_str = (this->options_to_interpret_->name_scope)._M_dataplus._M_p;
      relative_to._M_len = (this->options_to_interpret_->name_scope)._M_string_length;
      field = (FieldDescriptor *)
              LookupSymbol(pDVar14,name_00,relative_to,PLACEHOLDER_MESSAGE,LOOKUP_ALL,true);
      pDVar4 = (DescriptorBuilder *)this_00.ptr_;
      if (((SymbolBase *)field)->symbol_type_ == '\x02') goto LAB_001d1094;
      field = (FieldDescriptor *)0x0;
      this_00.ptr_ = (SymbolBase *)pDVar14;
LAB_001d12e8:
      if (this->builder_->pool_->allow_unknown_ == true) {
LAB_001d12f4:
        bVar6 = true;
        AddWithoutInterpreting
                  ((OptionInterpreter *)this_00.ptr_,this->uninterpreted_option_,local_130);
      }
      else if ((this->builder_->undefine_resolved_name_)._M_string_length == 0) {
        outstr._M_dataplus._M_p = (pointer)&debug_msg_name;
        make_error_04.invoker_ =
             absl::lts_20240722::functional_internal::
             InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption(google::protobuf::Message*,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,bool)::__3,std::__cxx11::string>
        ;
        make_error_04.ptr_.obj = &outstr;
        bVar6 = AddNameError(this,make_error_04);
      }
      else {
        outstr._M_string_length = (size_type)this;
        outstr._M_dataplus._M_p = (pointer)&debug_msg_name;
        make_error_01.invoker_ =
             absl::lts_20240722::functional_internal::
             InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption(google::protobuf::Message*,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,bool)::__2,std::__cxx11::string>
        ;
        make_error_01.ptr_.obj = &outstr;
        bVar6 = AddNameError(this,make_error_01);
      }
      goto LAB_001d1430;
    }
    outstr._M_string_length = *psVar15;
    outstr._M_dataplus._M_p = (pointer)psVar15[1];
    absl::lts_20240722::StrAppend((string *)&debug_msg_name,(AlphaNum *)&outstr);
    name_01._M_str = (char *)*psVar15;
    name_01._M_len = psVar15[1];
    field = Descriptor::FindFieldByName((Descriptor *)this_00.ptr_,name_01);
    pDVar14 = (DescriptorBuilder *)this_00.ptr_;
    pDVar4 = (DescriptorBuilder *)descriptor;
    if (field == (FieldDescriptor *)0x0) goto LAB_001d12e8;
LAB_001d1094:
    this_00.ptr_ = (SymbolBase *)pDVar4;
    pDVar4 = (DescriptorBuilder *)field->containing_type_;
    if (pDVar4 != (DescriptorBuilder *)this_00.ptr_) {
      if ((pDVar4 != (DescriptorBuilder *)0x0) &&
         (this_00.ptr_ = (SymbolBase *)pDVar14, ((ulong)pDVar4->pool_ & 0x100) != 0))
      goto LAB_001d12f4;
      outstr._M_string_length = (size_type)&descriptor;
      outstr._M_dataplus._M_p = (pointer)&debug_msg_name;
      make_error_00.invoker_ =
           absl::lts_20240722::functional_internal::
           InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption(google::protobuf::Message*,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,bool)::__4,std::__cxx11::string>
      ;
      make_error_00.ptr_.obj = &outstr;
      bVar6 = AddNameError(this,make_error_00);
      goto LAB_001d1430;
    }
    outstr._M_dataplus._M_p._0_4_ = field->number_;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&dest_path,(int *)&outstr);
    if (field->file_ == this->builder_->file_) {
      pVVar8 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                         (&(this->uninterpreted_option_->field_0)._impl_.name_.
                           super_RepeatedPtrFieldBase,0);
      bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((ulong)(pVVar8->field_0)._impl_.name_part_.tagged_ptr_.ptr_ &
                              0xfffffffffffffffc),"features");
      if ((bVar6) &&
         (pVVar8 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                             (&(this->uninterpreted_option_->field_0)._impl_.name_.
                               super_RepeatedPtrFieldBase,0),
         (pVVar8->field_0)._impl_.is_extension_ == false)) {
        outstr._M_dataplus._M_p = (pointer)&debug_msg_name;
        make_error_05.invoker_ =
             absl::lts_20240722::functional_internal::
             InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption(google::protobuf::Message*,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,bool)::__5,std::__cxx11::string>
        ;
        make_error_05.ptr_.obj = &outstr;
        bVar6 = AddNameError(this,make_error_05);
        goto LAB_001d1430;
      }
    }
    if (iVar13 < *(int *)((long)&this->uninterpreted_option_->field_0 + 0x10) + -1) {
      if ((field->type_ & 0xfe) != 10) {
        outstr._M_dataplus._M_p = (pointer)&debug_msg_name;
        make_error_02.invoker_ =
             absl::lts_20240722::functional_internal::
             InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption(google::protobuf::Message*,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,bool)::__6,std::__cxx11::string>
        ;
        make_error_02.ptr_.obj = &outstr;
        bVar6 = AddNameError(this,make_error_02);
        goto LAB_001d1430;
      }
      bVar6 = FieldDescriptor::is_repeated(field);
      if (bVar6) {
        outstr._M_dataplus._M_p = (pointer)&debug_msg_name;
        make_error_03.invoker_ =
             absl::lts_20240722::functional_internal::
             InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption(google::protobuf::Message*,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,bool)::__7,std::__cxx11::string>
        ;
        make_error_03.ptr_.obj = &outstr;
        bVar6 = AddNameError(this,make_error_03);
        goto LAB_001d1430;
      }
      std::
      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::push_back(&intermediate_fields,&field);
      this_00.ptr_ = &FieldDescriptor::message_type(field)->super_SymbolBase;
      descriptor = (Descriptor *)this_00.ptr_;
    }
  }
  bVar6 = FieldDescriptor::is_repeated(field);
  intermediate_fields_end =
       intermediate_fields.
       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  ppFVar16 = intermediate_fields.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  pMVar5 = local_130;
  innermost_field = field;
  if (!bVar6) {
    MVar17 = Message::GetMetadata(local_130);
    pUVar9 = Reflection::GetUnknownFields(MVar17.reflection,pMVar5);
    bVar6 = ExamineIfOptionIsSet
                      (this,(const_iterator)ppFVar16,(const_iterator)intermediate_fields_end,
                       innermost_field,&debug_msg_name,pUVar9);
    if (!bVar6) {
      bVar6 = false;
      goto LAB_001d1430;
    }
  }
  pUVar9 = (UnknownFieldSet *)operator_new(0x10);
  (pUVar9->fields_).soo_rep_.field_0.long_rep.elements_int = 0;
  (pUVar9->fields_).soo_rep_.field_0.short_rep.field_1 =
       (anon_union_8_2_4f9aec01_for_ShortSooRep_1)0x0;
  unknown_fields._M_t.
  super___uniq_ptr_impl<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::UnknownFieldSet_*,_std::default_delete<google::protobuf::UnknownFieldSet>_>
  .super__Head_base<0UL,_google::protobuf::UnknownFieldSet_*,_false>._M_head_impl =
       (__uniq_ptr_data<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>,_true,_true>
        )(__uniq_ptr_data<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>,_true,_true>
          )pUVar9;
  bVar6 = SetOptionValue(this,field,pUVar9);
  if (bVar6) {
    ppFVar16 = intermediate_fields.
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    while (ppFVar16 !=
           intermediate_fields.
           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ._M_impl.super__Vector_impl_data._M_start) {
      parent_unknown_fields._M_t.
      super___uniq_ptr_impl<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
      ._M_t.
      super__Tuple_impl<0UL,_google::protobuf::UnknownFieldSet_*,_std::default_delete<google::protobuf::UnknownFieldSet>_>
      .super__Head_base<0UL,_google::protobuf::UnknownFieldSet_*,_false>._M_head_impl =
           (__uniq_ptr_data<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>,_true,_true>
            )operator_new(0x10);
      *(undefined8 *)
       parent_unknown_fields._M_t.
       super___uniq_ptr_impl<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
       ._M_t.
       super__Tuple_impl<0UL,_google::protobuf::UnknownFieldSet_*,_std::default_delete<google::protobuf::UnknownFieldSet>_>
       .super__Head_base<0UL,_google::protobuf::UnknownFieldSet_*,_false>._M_head_impl = 0;
      *(undefined8 *)
       ((long)parent_unknown_fields._M_t.
              super___uniq_ptr_impl<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
              ._M_t.
              super__Tuple_impl<0UL,_google::protobuf::UnknownFieldSet_*,_std::default_delete<google::protobuf::UnknownFieldSet>_>
              .super__Head_base<0UL,_google::protobuf::UnknownFieldSet_*,_false>._M_head_impl + 8) =
           0;
      uVar1 = ppFVar16[-1]->type_;
      if (uVar1 == '\n') {
        pUVar9 = UnknownFieldSet::AddGroup
                           ((UnknownFieldSet *)
                            parent_unknown_fields._M_t.
                            super___uniq_ptr_impl<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_google::protobuf::UnknownFieldSet_*,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                            .super__Head_base<0UL,_google::protobuf::UnknownFieldSet_*,_false>.
                            _M_head_impl,ppFVar16[-1]->number_);
        UnknownFieldSet::MergeFrom
                  (pUVar9,(UnknownFieldSet *)
                          unknown_fields._M_t.
                          super___uniq_ptr_impl<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_google::protobuf::UnknownFieldSet_*,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                          .super__Head_base<0UL,_google::protobuf::UnknownFieldSet_*,_false>.
                          _M_head_impl);
      }
      else {
        if (uVar1 != '\v') {
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&outstr,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/descriptor.cc"
                     ,0x22e8);
          pLVar11 = absl::lts_20240722::log_internal::LogMessage::operator<<
                              ((LogMessage *)&outstr,
                               (char (*) [40])"Invalid wire type for CPPTYPE_MESSAGE: ");
          local_60.piece_._M_len = CONCAT44(local_60.piece_._M_len._4_4_,(uint)ppFVar16[-1]->type_);
          absl::lts_20240722::log_internal::LogMessage::
          operator<<<google::protobuf::internal::FieldDescriptorLite::Type,_0>
                    (pLVar11,(Type *)&local_60);
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&outstr);
        }
        outstr._M_string_length = 0;
        outstr._M_dataplus._M_p = (pointer)&outstr.field_2;
        outstr.field_2._M_local_buf[0] = '\0';
        bVar7 = UnknownFieldSet::SerializeToString
                          ((UnknownFieldSet *)
                           unknown_fields._M_t.
                           super___uniq_ptr_impl<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_google::protobuf::UnknownFieldSet_*,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                           .super__Head_base<0UL,_google::protobuf::UnknownFieldSet_*,_false>.
                           _M_head_impl,&outstr);
        if (!bVar7) {
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_60,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/descriptor.cc"
                     ,0x22d9,0x2a,"unknown_fields->SerializeToString(&outstr)");
          pLVar11 = absl::lts_20240722::log_internal::LogMessage::operator<<
                              ((LogMessage *)&local_60,
                               (char (*) [56])
                               "Unexpected failure while serializing option submessage ");
          pLVar11 = (LogMessage *)
                    absl::lts_20240722::log_internal::LogMessage::operator<<
                              (pLVar11,(string *)&debug_msg_name);
          absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar11,(char (*) [3])0x341e91);
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_60);
        }
        UnknownFieldSet::AddLengthDelimited<>
                  ((UnknownFieldSet *)
                   parent_unknown_fields._M_t.
                   super___uniq_ptr_impl<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::UnknownFieldSet_*,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                   .super__Head_base<0UL,_google::protobuf::UnknownFieldSet_*,_false>._M_head_impl,
                   ppFVar16[-1]->number_,&outstr);
        std::__cxx11::string::~string((string *)&outstr);
      }
      __p._M_t.
      super___uniq_ptr_impl<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
      ._M_t.
      super__Tuple_impl<0UL,_google::protobuf::UnknownFieldSet_*,_std::default_delete<google::protobuf::UnknownFieldSet>_>
      .super__Head_base<0UL,_google::protobuf::UnknownFieldSet_*,_false>._M_head_impl =
           parent_unknown_fields._M_t.
           super___uniq_ptr_impl<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::UnknownFieldSet_*,_std::default_delete<google::protobuf::UnknownFieldSet>_>
           .super__Head_base<0UL,_google::protobuf::UnknownFieldSet_*,_false>._M_head_impl;
      parent_unknown_fields._M_t.
      super___uniq_ptr_impl<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
      ._M_t.
      super__Tuple_impl<0UL,_google::protobuf::UnknownFieldSet_*,_std::default_delete<google::protobuf::UnknownFieldSet>_>
      .super__Head_base<0UL,_google::protobuf::UnknownFieldSet_*,_false>._M_head_impl =
           (__uniq_ptr_data<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>,_true,_true>
            )(__uniq_ptr_impl<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
              )0x0;
      std::
      __uniq_ptr_impl<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
      ::reset((__uniq_ptr_impl<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
               *)&unknown_fields,
              (pointer)__p._M_t.
                       super___uniq_ptr_impl<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_google::protobuf::UnknownFieldSet_*,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                       .super__Head_base<0UL,_google::protobuf::UnknownFieldSet_*,_false>.
                       _M_head_impl);
      std::
      unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
      ::~unique_ptr(&parent_unknown_fields);
      ppFVar16 = ppFVar16 + -1;
    }
    MVar17 = Message::GetMetadata(local_130);
    pUVar9 = Reflection::MutableUnknownFields(MVar17.reflection,local_130);
    UnknownFieldSet::MergeFrom
              (pUVar9,(UnknownFieldSet *)
                      unknown_fields._M_t.
                      super___uniq_ptr_impl<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::UnknownFieldSet_*,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                      .super__Head_base<0UL,_google::protobuf::UnknownFieldSet_*,_false>.
                      _M_head_impl);
    bVar7 = FieldDescriptor::is_repeated(field);
    if (bVar7) {
      piVar10 = absl::lts_20240722::container_internal::
                raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::vector<int,std::allocator<int>>,int>,absl::lts_20240722::hash_internal::Hash<std::vector<int,std::allocator<int>>>,std::equal_to<std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::vector<int,std::allocator<int>>const,int>>>
                ::
                operator[]<std::vector<int,std::allocator<int>>,absl::lts_20240722::container_internal::FlatHashMapPolicy<std::vector<int,std::allocator<int>>,int>>
                          ((raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::vector<int,std::allocator<int>>,int>,absl::lts_20240722::hash_internal::Hash<std::vector<int,std::allocator<int>>>,std::equal_to<std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::vector<int,std::allocator<int>>const,int>>>
                            *)&this->repeated_option_counts_,&dest_path);
      iVar13 = *piVar10;
      *piVar10 = iVar13 + 1;
      outstr._M_dataplus._M_p._0_4_ = iVar13;
      std::vector<int,_std::allocator<int>_>::push_back(&dest_path,(value_type_conflict3 *)&outstr);
    }
    this_01 = absl::lts_20240722::container_internal::
              raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>,absl::lts_20240722::hash_internal::Hash<std::vector<int,std::allocator<int>>>,std::equal_to<std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::vector<int,std::allocator<int>>const,std::vector<int,std::allocator<int>>>>>
              ::
              operator[]<std::vector<int,std::allocator<int>>,absl::lts_20240722::container_internal::FlatHashMapPolicy<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>>
                        ((raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>,absl::lts_20240722::hash_internal::Hash<std::vector<int,std::allocator<int>>>,std::equal_to<std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::vector<int,std::allocator<int>>const,std::vector<int,std::allocator<int>>>>>
                          *)&this->interpreted_paths_,src_path);
    std::vector<int,_std::allocator<int>_>::operator=(this_01,&dest_path);
  }
  std::
  unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
  ::~unique_ptr(&unknown_fields);
LAB_001d1430:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&dest_path.super__Vector_base<int,_std::allocator<int>_>);
  std::__cxx11::string::~string((string *)&debug_msg_name);
  std::
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~_Vector_base(&intermediate_fields.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 );
  return bVar6;
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::InterpretSingleOption(
    Message* options, const std::vector<int>& src_path,
    const std::vector<int>& options_path, bool skip_extensions) {
  // First do some basic validation.
  if (uninterpreted_option_->name_size() == 0) {
    // This should never happen unless the parser has gone seriously awry or
    // someone has manually created the uninterpreted option badly.
    if (skip_extensions) {
      // Come back to it later.
      return true;
    }
    return AddNameError(
        []() -> std::string { return "Option must have a name."; });
  }
  if (uninterpreted_option_->name(0).name_part() == "uninterpreted_option") {
    if (skip_extensions) {
      // Come back to it later.
      return true;
    }
    return AddNameError([]() -> std::string {
      return "Option must not use reserved name \"uninterpreted_option\".";
    });
  }

  if (skip_extensions == uninterpreted_option_->name(0).is_extension()) {
    // Allow feature and option interpretation to occur in two phases.  This is
    // necessary because features *are* options and need to be interpreted
    // before resolving them.  However, options can also *have* features
    // attached to them.
    return true;
  }

  const Descriptor* options_descriptor = nullptr;
  // Get the options message's descriptor from the builder's pool, so that we
  // get the version that knows about any extension options declared in the file
  // we're currently building. The descriptor should be there as long as the
  // file we're building imported descriptor.proto.

  // Note that we use DescriptorBuilder::FindSymbolNotEnforcingDeps(), not
  // DescriptorPool::FindMessageTypeByName() because we're already holding the
  // pool's mutex, and the latter method locks it again.  We don't use
  // FindSymbol() because files that use custom options only need to depend on
  // the file that defines the option, not descriptor.proto itself.
  Symbol symbol = builder_->FindSymbolNotEnforcingDeps(
      options->GetDescriptor()->full_name());
  options_descriptor = symbol.descriptor();
  if (options_descriptor == nullptr) {
    // The options message's descriptor was not in the builder's pool, so use
    // the standard version from the generated pool. We're not holding the
    // generated pool's mutex, so we can search it the straightforward way.
    options_descriptor = options->GetDescriptor();
  }
  ABSL_CHECK(options_descriptor);

  // We iterate over the name parts to drill into the submessages until we find
  // the leaf field for the option. As we drill down we remember the current
  // submessage's descriptor in |descriptor| and the next field in that
  // submessage in |field|. We also track the fields we're drilling down
  // through in |intermediate_fields|. As we go, we reconstruct the full option
  // name in |debug_msg_name|, for use in error messages.
  const Descriptor* descriptor = options_descriptor;
  const FieldDescriptor* field = nullptr;
  std::vector<const FieldDescriptor*> intermediate_fields;
  std::string debug_msg_name = "";

  std::vector<int> dest_path = options_path;

  for (int i = 0; i < uninterpreted_option_->name_size(); ++i) {
    builder_->undefine_resolved_name_.clear();
    const std::string& name_part = uninterpreted_option_->name(i).name_part();
    if (!debug_msg_name.empty()) {
      absl::StrAppend(&debug_msg_name, ".");
    }
    if (uninterpreted_option_->name(i).is_extension()) {
      absl::StrAppend(&debug_msg_name, "(", name_part, ")");
      // Search for the extension's descriptor as an extension in the builder's
      // pool. Note that we use DescriptorBuilder::LookupSymbol(), not
      // DescriptorPool::FindExtensionByName(), for two reasons: 1) It allows
      // relative lookups, and 2) because we're already holding the pool's
      // mutex, and the latter method locks it again.
      symbol =
          builder_->LookupSymbol(name_part, options_to_interpret_->name_scope);
      field = symbol.field_descriptor();
      // If we don't find the field then the field's descriptor was not in the
      // builder's pool, but there's no point in looking in the generated
      // pool. We require that you import the file that defines any extensions
      // you use, so they must be present in the builder's pool.
    } else {
      absl::StrAppend(&debug_msg_name, name_part);
      // Search for the field's descriptor as a regular field.
      field = descriptor->FindFieldByName(name_part);
    }

    if (field == nullptr) {
      if (get_allow_unknown(builder_->pool_)) {
        // We can't find the option, but AllowUnknownDependencies() is enabled,
        // so we will just leave it as uninterpreted.
        AddWithoutInterpreting(*uninterpreted_option_, options);
        return true;
      } else if (!(builder_->undefine_resolved_name_).empty()) {
        // Option is resolved to a name which is not defined.
        return AddNameError([&] {
          return absl::StrCat(
              "Option \"", debug_msg_name, "\" is resolved to \"(",
              builder_->undefine_resolved_name_,
              ")\", which is not defined. The innermost scope is searched "
              "first "
              "in name resolution. Consider using a leading '.'(i.e., \"(.",
              debug_msg_name.substr(1),
              "\") to start from the outermost scope.");
        });
      } else {
        return AddNameError([&] {
          return absl::StrCat(
              "Option \"", debug_msg_name, "\" unknown. Ensure that your proto",
              " definition file imports the proto which defines the option.");
        });
      }
    } else if (field->containing_type() != descriptor) {
      if (get_is_placeholder(field->containing_type())) {
        // The field is an extension of a placeholder type, so we can't
        // reliably verify whether it is a valid extension to use here (e.g.
        // we don't know if it is an extension of the correct *Options message,
        // or if it has a valid field number, etc.).  Just leave it as
        // uninterpreted instead.
        AddWithoutInterpreting(*uninterpreted_option_, options);
        return true;
      } else {
        // This can only happen if, due to some insane misconfiguration of the
        // pools, we find the options message in one pool but the field in
        // another. This would probably imply a hefty bug somewhere.
        return AddNameError([&] {
          return absl::StrCat("Option field \"", debug_msg_name,
                              "\" is not a field or extension of message \"",
                              descriptor->name(), "\".");
        });
      }
    } else {
      // accumulate field numbers to form path to interpreted option
      dest_path.push_back(field->number());

      // Special handling to prevent feature use in the same file as the
      // definition.
      // TODO Add proper support for cases where this can work.
      if (field->file() == builder_->file_ &&
          uninterpreted_option_->name(0).name_part() == "features" &&
          !uninterpreted_option_->name(0).is_extension()) {
        return AddNameError([&] {
          return absl::StrCat(
              "Feature \"", debug_msg_name,
              "\" can't be used in the same file it's defined in.");
        });
      }

      if (i < uninterpreted_option_->name_size() - 1) {
        if (field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
          return AddNameError([&] {
            return absl::StrCat("Option \"", debug_msg_name,
                                "\" is an atomic type, not a message.");
          });
        } else if (field->is_repeated()) {
          return AddNameError([&] {
            return absl::StrCat("Option field \"", debug_msg_name,
                                "\" is a repeated message. Repeated message "
                                "options must be initialized using an "
                                "aggregate value.");
          });
        } else {
          // Drill down into the submessage.
          intermediate_fields.push_back(field);
          descriptor = field->message_type();
        }
      }
    }
  }

  // We've found the leaf field. Now we use UnknownFieldSets to set its value
  // on the options message. We do so because the message may not yet know
  // about its extension fields, so we may not be able to set the fields
  // directly. But the UnknownFieldSets will serialize to the same wire-format
  // message, so reading that message back in once the extension fields are
  // known will populate them correctly.

  // First see if the option is already set.
  if (!field->is_repeated() &&
      !ExamineIfOptionIsSet(
          intermediate_fields.begin(), intermediate_fields.end(), field,
          debug_msg_name,
          options->GetReflection()->GetUnknownFields(*options))) {
    return false;  // ExamineIfOptionIsSet() already added the error.
  }

  // First set the value on the UnknownFieldSet corresponding to the
  // innermost message.
  std::unique_ptr<UnknownFieldSet> unknown_fields(new UnknownFieldSet());
  if (!SetOptionValue(field, unknown_fields.get())) {
    return false;  // SetOptionValue() already added the error.
  }

  // Now wrap the UnknownFieldSet with UnknownFieldSets corresponding to all
  // the intermediate messages.
  for (std::vector<const FieldDescriptor*>::reverse_iterator iter =
           intermediate_fields.rbegin();
       iter != intermediate_fields.rend(); ++iter) {
    std::unique_ptr<UnknownFieldSet> parent_unknown_fields(
        new UnknownFieldSet());
    switch ((*iter)->type()) {
      case FieldDescriptor::TYPE_MESSAGE: {
        std::string outstr;
        ABSL_CHECK(unknown_fields->SerializeToString(&outstr))
            << "Unexpected failure while serializing option submessage "
            << debug_msg_name << "\".";
        parent_unknown_fields->AddLengthDelimited((*iter)->number(),
                                                  std::move(outstr));
        break;
      }

      case FieldDescriptor::TYPE_GROUP: {
        parent_unknown_fields->AddGroup((*iter)->number())
            ->MergeFrom(*unknown_fields);
        break;
      }

      default:
        ABSL_LOG(FATAL) << "Invalid wire type for CPPTYPE_MESSAGE: "
                        << (*iter)->type();
        return false;
    }
    unknown_fields = std::move(parent_unknown_fields);
  }

  // Now merge the UnknownFieldSet corresponding to the top-level message into
  // the options message.
  options->GetReflection()->MutableUnknownFields(options)->MergeFrom(
      *unknown_fields);

  // record the element path of the interpreted option
  if (field->is_repeated()) {
    int index = repeated_option_counts_[dest_path]++;
    dest_path.push_back(index);
  }
  interpreted_paths_[src_path] = dest_path;

  return true;
}